

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O0

int __thiscall SRUP_Crypto::_decrypt(SRUP_Crypto *this,RSA *rsa_key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  EVP_PKEY *pkey_00;
  EVP_CIPHER_CTX *ctx_00;
  uchar *ek;
  EVP_CIPHER *pEVar5;
  uint8_t *puVar6;
  ulong uVar7;
  int x;
  int data_size;
  int read_size;
  uint8_t iv [16];
  short local_205c [2];
  uchar local_2058 [4];
  int final_len;
  uint8_t final [4096];
  int local_104c;
  uchar local_1048 [4];
  int body_len;
  uint8_t body [4096];
  int iv_len;
  int evp_key_len;
  uint8_t *evp_key;
  EVP_PKEY *pkey;
  EVP_CIPHER_CTX *ctx;
  RSA *rsa_key_local;
  SRUP_Crypto *this_local;
  
  pkey_00 = EVP_PKEY_new();
  iVar2 = EVP_PKEY_assign(pkey_00,6,rsa_key);
  if (iVar2 == 0) {
    EVP_PKEY_free(pkey_00);
    this_local._0_4_ = 0;
  }
  else {
    ctx_00 = EVP_CIPHER_CTX_new();
    EVP_CIPHER_CTX_reset(ctx_00);
    iVar2 = *(int *)this->m_crypt;
    iVar3 = EVP_PKEY_get_size(pkey_00);
    if (iVar3 < iVar2) {
      EVP_PKEY_free(pkey_00);
      EVP_CIPHER_CTX_free(ctx_00);
      this_local._0_4_ = 0;
    }
    else {
      uVar7 = (ulong)iVar2;
      if ((long)uVar7 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      ek = (uchar *)operator_new__(uVar7);
      memcpy(ek,this->m_crypt + 4,(long)iVar2);
      pEVar5 = EVP_aes_256_cbc();
      iVar4 = EVP_CIPHER_get_iv_length(pEVar5);
      memcpy(&data_size,this->m_crypt + (iVar2 + 4),(long)iVar4);
      iVar4 = iVar4 + iVar2 + 4;
      iVar3 = *(int *)(this->m_crypt + iVar4);
      iVar1 = *(int *)(this->m_crypt + (iVar4 + 4));
      pEVar5 = EVP_aes_256_cbc();
      iVar2 = EVP_OpenInit(ctx_00,pEVar5,ek,iVar2,(uchar *)&data_size,pkey_00);
      if (iVar2 == 0) {
        if (ek != (uchar *)0x0) {
          operator_delete__(ek);
        }
        EVP_PKEY_free(pkey_00);
        EVP_CIPHER_CTX_free(ctx_00);
        this_local._0_4_ = 0;
      }
      else {
        iVar2 = EVP_DecryptUpdate(ctx_00,local_1048,&local_104c,this->m_crypt + (iVar4 + 8),iVar3);
        if (iVar2 == 0) {
          if (ek != (uchar *)0x0) {
            operator_delete__(ek);
          }
          EVP_PKEY_free(pkey_00);
          EVP_CIPHER_CTX_free(ctx_00);
          this_local._0_4_ = 0;
        }
        else {
          iVar2 = EVP_OpenFinal(ctx_00,local_2058,(int *)local_205c);
          if (iVar2 == 0) {
            if (ek != (uchar *)0x0) {
              operator_delete__(ek);
            }
            EVP_PKEY_free(pkey_00);
            EVP_CIPHER_CTX_free(ctx_00);
            this_local._0_4_ = 0;
          }
          else {
            this->m_plain_text_length = (short)local_104c + local_205c[0];
            puVar6 = (uint8_t *)operator_new__((ulong)this->m_plain_text_length);
            this->m_plain_text = puVar6;
            memcpy(this->m_plain_text,local_1048,(long)local_104c);
            memcpy(this->m_plain_text + local_104c,local_2058,(long)iVar1 - (long)local_104c);
            EVP_PKEY_free(pkey_00);
            EVP_CIPHER_CTX_free(ctx_00);
            if (ek != (uchar *)0x0) {
              operator_delete__(ek);
            }
            this_local._0_4_ = (int)this->m_plain_text;
          }
        }
      }
    }
  }
  return (int)this_local;
}

Assistant:

uint8_t* SRUP_Crypto::_decrypt(RSA *rsa_key)
{
    EVP_CIPHER_CTX* ctx;
    EVP_PKEY *pkey;
    uint8_t* evp_key;

    int evp_key_len;
    int iv_len;
    uint8_t body[4096];
    int body_len;
    uint8_t final[4096];
    int final_len;
    uint8_t iv[EVP_MAX_IV_LENGTH];

    int read_size;
    int data_size;

    pkey = EVP_PKEY_new();

    if (!EVP_PKEY_assign_RSA(pkey, rsa_key))
    {
        EVP_PKEY_free(pkey);
        return nullptr;
    }

    ctx=EVP_CIPHER_CTX_new();

    EVP_CIPHER_CTX_init(ctx);
    int x=0;

    // We now start reading data from m_crypt - in the same order as we wrote it...

    // Key length
    std::memcpy(&evp_key_len, m_crypt, sizeof(int));
    x+=sizeof(int);
    if (evp_key_len > EVP_PKEY_size(pkey))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    evp_key = new uint8_t[evp_key_len];

    // Key value
    std::memcpy(evp_key, m_crypt+x, (size_t) evp_key_len);
    x+= evp_key_len;

    // IV (a fixed size...)
    iv_len = EVP_CIPHER_iv_length(EVP_aes_256_cbc());
    std::memcpy(&iv, m_crypt+x, (size_t) iv_len);
    x+=iv_len;

    // Encrypted data size
    std::memcpy(&read_size, m_crypt+x, sizeof(int));
    x+=sizeof(int);

    // Actual data size (excluding padding)
    std::memcpy(&data_size, m_crypt+x, sizeof(int));
    x+=sizeof(int);

    // Now the encrypted data
    // Initialize...
    if (!EVP_OpenInit(ctx, EVP_aes_256_cbc(), evp_key, evp_key_len, iv, pkey))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    // ...read the first block...
    if (!EVP_OpenUpdate(ctx, body, &body_len, m_crypt+x, read_size))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    // ... and then read the final block (including padding)
    // See previous note about expected data sizes...
    if (!EVP_OpenFinal(ctx, final, &final_len))
    {
        delete[] evp_key;
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        return nullptr;
    }

    m_plain_text_length = (uint16_t) body_len + (uint16_t) final_len;
    m_plain_text = new uint8_t[m_plain_text_length];
    std::memcpy(m_plain_text, body, (size_t) body_len);
    std::memcpy(m_plain_text + body_len, final, (size_t) data_size - body_len);

    EVP_PKEY_free(pkey);
    EVP_CIPHER_CTX_free(ctx);
    delete[] evp_key;

    return m_plain_text;
}